

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_start_string(flatcc_builder_t *B)

{
  int iVar1;
  flatcc_builder_t *B_local;
  
  iVar1 = enter_frame(B,1);
  if (iVar1 == 0) {
    (B->frame->container).table.vs_end = 1;
    (B->frame->container).table.pl_end = 0;
    B->frame->type = 6;
    refresh_ds(B,0xfffffffc);
    B_local._4_4_ = 0;
  }
  else {
    B_local._4_4_ = -1;
  }
  return B_local._4_4_;
}

Assistant:

int flatcc_builder_start_string(flatcc_builder_t *B)
{
    if (enter_frame(B, 1)) {
        return -1;
    }
    frame(container.vector.elem_size) = 1;
    frame(container.vector.count) = 0;
    frame(type) = flatcc_builder_string;
    refresh_ds(B, data_limit);
    return 0;
}